

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseImplicitTypeDefsCtx::makeTypeUse
          (Result<wasm::Ok> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *this,Index pos,
          optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
          param_2,ParamsT *params,ResultsT *results)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pNVar3;
  ulong uVar4;
  void *pvVar5;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *this_00;
  iterator __position;
  Signature sig;
  bool bVar6;
  pointer pTVar7;
  pointer pTVar8;
  ulong *puVar9;
  Type *__args;
  pointer pNVar10;
  long lVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Signature,_wasm::HeapType>,_false,_true>,_bool>
  pVar12;
  Err local_100;
  string local_e0;
  Type local_c0;
  Type local_b8;
  ParseImplicitTypeDefsCtx *local_b0;
  undefined1 auStack_a8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> resultTypes;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_88;
  long lStack_70;
  Index IStack_68;
  undefined4 uStack_64;
  HeapType type;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_50;
  
  local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = pos;
  if (params != (ParamsT *)0x0) {
    _IStack_68 = 0;
    type.id = 0;
    local_b0 = this;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98,
               ((long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pNVar10 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pNVar3 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pNVar10 != pNVar3) {
      __args = &pNVar10->type;
      do {
        if (type.id == 0) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)&stack0xffffffffffffff98,
                     (iterator)0x0,__args);
        }
        else {
          *(uintptr_t *)type.id = __args->id;
          type.id = type.id + 8;
        }
        pNVar10 = (pointer)(__args + 1);
        __args = __args + 3;
      } while (pNVar10 != pNVar3);
    }
    pTVar8 = local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pTVar7 = local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    this = local_b0;
    local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_IStack_68;
    local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)type.id;
    local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _IStack_68 = 0;
    type.id = 0;
    if ((pTVar7 != (pointer)0x0) &&
       (operator_delete(pTVar7,(long)pTVar8 - (long)pTVar7), (pointer)_IStack_68 != (pointer)0x0)) {
      operator_delete((void *)_IStack_68,-_IStack_68);
    }
  }
  auStack_a8 = (undefined1  [8])0x0;
  resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (results != (ResultsT *)0x0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8,results);
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98,&local_88);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_50,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8);
  lVar11 = 0;
  do {
    for (puVar9 = *(ulong **)((long)&stack0xffffffffffffff98 + lVar11);
        puVar9 != *(ulong **)((long)&type.id + lVar11); puVar9 = puVar9 + 1) {
      uVar4 = *puVar9;
      if ((uVar4 < 2) || ((uVar4 & 1) != 0 && 6 < uVar4)) {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"tuple types not allowed in signature","");
        Lexer::err(&local_100,&this->in,&local_e0);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        paVar2 = &local_100.msg.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.msg._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_100.msg.field_2._M_allocated_capacity._1_7_,
                             local_100.msg.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
               local_100.msg.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_100.msg._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(local_100.msg.field_2._M_allocated_capacity._1_7_,
                        local_100.msg.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
             local_100.msg._M_string_length;
        local_100.msg._M_string_length = 0;
        local_100.msg.field_2._M_local_buf[0] = '\0';
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        local_100.msg._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        bVar6 = false;
        goto LAB_00bc1996;
      }
    }
    lVar11 = lVar11 + 0x18;
    if (lVar11 == 0x30) {
      bVar6 = true;
LAB_00bc1996:
      lVar11 = 0x30;
      do {
        pvVar5 = *(void **)((long)&local_88.
                                   super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + lVar11);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)&lStack_70 + lVar11) - (long)pvVar5);
        }
        lVar11 = lVar11 + -0x18;
      } while (lVar11 != 0);
      if (bVar6) {
        wasm::Type::Type(&local_c0,&local_88);
        wasm::Type::Type(&local_b8,(Tuple *)auStack_a8);
        sig.results.id = local_b8.id;
        sig.params.id = local_c0.id;
        _IStack_68 = local_c0.id;
        type.id = local_b8.id;
        pVar12 = std::
                 _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::Signature_const,wasm::HeapType>>
                           ((_Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)&this->sigTypes);
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          HeapType::HeapType((HeapType *)&stack0xffffffffffffff98,sig);
          *(uintptr_t *)
           ((long)pVar12.first.
                  super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>.
                  _M_cur.
                  super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>
           + 0x18) = _IStack_68;
          this_00 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)this->types;
          __position._M_current = *(HeapType **)(this_00 + 8);
          if (__position._M_current == *(HeapType **)(this_00 + 0x10)) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      (this_00,__position,(HeapType *)&stack0xffffffffffffff98);
          }
          else {
            (__position._M_current)->id = _IStack_68;
            *(HeapType **)(this_00 + 8) = __position._M_current + 1;
          }
        }
        IStack_68 = resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
        type.id = *(uintptr_t *)
                   ((long)pVar12.first.
                          super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>
                   + 0x18);
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::HeapType>,std::allocator<std::pair<unsigned_int_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_int_const,wasm::HeapType>>(this->implicitTypes);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      if (auStack_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_a8,
                        (long)resultTypes.
                              super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)auStack_a8);
      }
      if (local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Result<TypeUseT> makeTypeUse(Index pos,
                               std::optional<HeapTypeT>,
                               ParamsT* params,
                               ResultsT* results) {
    std::vector<Type> paramTypes;
    if (params) {
      paramTypes = getUnnamedTypes(*params);
    }

    std::vector<Type> resultTypes;
    if (results) {
      resultTypes = *results;
    }

    for (auto& v : {paramTypes, resultTypes}) {
      for (auto t : v) {
        if (!t.isSingle()) {
          return in.err("tuple types not allowed in signature");
        }
      }
    }

    auto sig = Signature(Type(paramTypes), Type(resultTypes));
    auto [it, inserted] = sigTypes.insert({sig, HeapType(HeapType::func)});
    if (inserted) {
      auto type = HeapType(sig);
      it->second = type;
      types.push_back(type);
    }
    implicitTypes.insert({pos, it->second});

    return Ok{};
  }